

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O2

int Abc_NtkFinRefinement
              (Abc_Ntk_t *pNtk,Vec_Int_t *vTypes,Vec_Int_t *vCos,Vec_Int_t *vCis,Vec_Int_t *vNodes,
              Vec_Int_t *vPairs,Vec_Int_t *vList,Vec_Wec_t *vMap2,Vec_Wec_t *vResult)

{
  int iVar1;
  int Entry1;
  int Entry2;
  int iVar2;
  Vec_Wec_t *p;
  Vec_Wrd_t *vSims;
  word *__s;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int local_ac;
  int Types [2];
  int Objs [2];
  
  p = Vec_WecAlloc(100);
  iVar7 = ((vList->nSize >> 6) + 1) - (uint)((vList->nSize & 0x3fU) == 0);
  iVar6 = pNtk->vObjs->nSize;
  iVar8 = iVar7 * iVar6;
  vSims = (Vec_Wrd_t *)malloc(0x10);
  iVar1 = 0x10;
  if (0xe < iVar8 - 1U) {
    iVar1 = iVar8;
  }
  vSims->nCap = iVar1;
  iVar5 = 0;
  if (iVar1 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar1 << 3);
  }
  vSims->pArray = __s;
  vSims->nSize = iVar8;
  memset(__s,0,(long)iVar8 << 3);
  p_00 = Vec_IntStart(iVar6 * 2);
  pVVar3 = Vec_WecPushLevel(p);
  Abc_NtkFinLocalSetup(vPairs,vList,vMap2,pVVar3);
  for (; iVar5 != 2; iVar5 = iVar5 + 1) {
    pVVar3 = Vec_IntAlloc(vCis->nSize);
    Vec_IntFill(pVVar3,vCis->nSize,iVar5);
    Abc_NtkFinSimulateOne(pNtk,vTypes,vCos,vCis,vNodes,vMap2,pVVar3,vSims,iVar7,vPairs,p,0,1);
    Vec_IntFree(pVVar3);
  }
  iVar6 = 0;
  local_ac = 0;
  do {
    iVar1 = p->nSize;
    if (iVar1 <= iVar6) {
      Abc_NtkFinLocalSetdown(vPairs,vList,vMap2);
      iVar6 = 0;
      if (iVar1 < 1) {
        iVar1 = 0;
        iVar6 = 0;
      }
      while( true ) {
        if (iVar6 == iVar1) {
          Vec_WecFree(p);
          free(__s);
          free(vSims);
          Vec_IntFree(p_00);
          return local_ac;
        }
        pVVar3 = Vec_WecEntry(p,iVar6);
        if ((pVVar3->nSize & 1U) != 0) break;
        if (2 < pVVar3->nSize) {
          pVVar4 = Vec_WecPushLevel(vResult);
          for (iVar7 = 1; iVar7 < pVVar3->nSize; iVar7 = iVar7 + 2) {
            iVar8 = Vec_IntEntry(pVVar3,iVar7 + -1);
            Vec_IntEntry(pVVar3,iVar7);
            Vec_IntPush(pVVar4,iVar8);
          }
        }
        iVar6 = iVar6 + 1;
      }
      __assert_fail("Vec_IntSize(vArray) % 2 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDetect.c"
                    ,0x404,
                    "int Abc_NtkFinRefinement(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *)"
                   );
    }
    pVVar3 = Vec_WecEntry(p,iVar6);
    iVar1 = Vec_IntEntry(pVVar3,0);
    iVar8 = 2;
    while (iVar5 = iVar8 + 1, iVar5 < pVVar3->nSize) {
      Entry1 = Vec_IntEntry(pVVar3,iVar8);
      Entry2 = Vec_IntEntry(pVVar3,iVar5);
      Objs[0] = Vec_IntEntry(vPairs,iVar1 * 2);
      Objs[1] = Vec_IntEntry(vPairs,Entry1 * 2);
      Types[0] = Vec_IntEntry(vPairs,iVar1 * 2 + 1);
      Types[1] = Vec_IntEntry(vPairs,Entry1 * 2 + 1);
      pVVar4 = Abc_NtkFinCheckPair(pNtk,vTypes,vCos,vCis,vNodes,Objs,Types,p_00);
      if (pVVar4 == (Vec_Int_t *)0x0) {
        iVar8 = iVar8 + 2;
      }
      else {
        iVar2 = Vec_IntEntry(pVVar3,iVar8);
        if (iVar2 != Entry1) {
          __assert_fail("Vec_IntEntry(vClass, k) == iFin",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDetect.c"
                        ,0x3ec,
                        "int Abc_NtkFinRefinement(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *)"
                       );
        }
        if (pVVar4->nSize == 0) {
          pVVar3 = Vec_WecPushLevel(p);
          Vec_IntPushTwo(pVVar3,Entry1,Entry2);
          pVVar3 = Vec_WecEntry(p,iVar6);
          Vec_IntDrop(pVVar3,iVar5);
          Vec_IntDrop(pVVar3,iVar8);
        }
        else {
          Abc_NtkFinSimulateOne
                    (pNtk,vTypes,vCos,vCis,vNodes,vMap2,pVVar4,vSims,iVar7,vPairs,p,iVar6,iVar8 / 2)
          ;
        }
        Vec_IntFree(pVVar4);
        pVVar3 = Vec_WecEntry(p,iVar6);
        if (iVar8 < pVVar3->nSize) {
          iVar5 = Vec_IntEntry(pVVar3,iVar8);
          if (iVar5 == Entry1) {
            __assert_fail("Vec_IntSize(vClass) <= k || Vec_IntEntry(vClass, k) != iFin",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDetect.c"
                          ,0x3fa,
                          "int Abc_NtkFinRefinement(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *)"
                         );
          }
        }
      }
      local_ac = local_ac + 1;
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

int Abc_NtkFinRefinement( Abc_Ntk_t * pNtk, Vec_Int_t * vTypes, Vec_Int_t * vCos, Vec_Int_t * vCis, Vec_Int_t * vNodes, 
                          Vec_Int_t * vPairs, Vec_Int_t * vList, Vec_Wec_t * vMap2, Vec_Wec_t * vResult )
{
    Vec_Wec_t * vRes  = Vec_WecAlloc( 100 );
    int nWords = Abc_Bit6WordNum( Vec_IntSize(vList) );
    Vec_Wrd_t * vSims = Vec_WrdStart( nWords * Abc_NtkObjNumMax(pNtk) );  // simulation info for each object
    Vec_Int_t * vLits = Vec_IntStart( 2*Abc_NtkObjNumMax(pNtk) );         // two literals for each object
    Vec_Int_t * vPat, * vClass, * vArray;  
    int i, k, iFin, Index, nCalls = 0;
    // prepare
    vArray = Vec_WecPushLevel( vRes );
    Abc_NtkFinLocalSetup( vPairs, vList, vMap2, vArray );
    // try all-0/all-1 pattern
    for ( i = 0; i < 2; i++ )
    {
        vPat = Vec_IntAlloc( Vec_IntSize(vCis) );
        Vec_IntFill( vPat, Vec_IntSize(vCis), i );
        Abc_NtkFinSimulateOne( pNtk, vTypes, vCos, vCis, vNodes, vMap2, vPat, vSims, nWords, vPairs, vRes, 0, 1 );
        Vec_IntFree( vPat );
    }
    // explore the classes
    //Vec_WecPrint( vRes, 0 );
    Vec_WecForEachLevel( vRes, vClass, i )
    {
        int iFin0  = Vec_IntEntry( vClass, 0 );
        Vec_IntForEachEntryDoubleStart( vClass, iFin, Index, k, 2 )
        {
            int Objs[2]  = { Vec_IntEntry(vPairs, 2*iFin0),   Vec_IntEntry(vPairs, 2*iFin)   }; 
            int Types[2] = { Vec_IntEntry(vPairs, 2*iFin0+1), Vec_IntEntry(vPairs, 2*iFin+1) }; 
            nCalls++;
            //printf( "Checking pair %d and %d.\n", iFin0, iFin );
            vPat = Abc_NtkFinCheckPair( pNtk, vTypes, vCos, vCis, vNodes, Objs, Types, vLits );
            if ( vPat == NULL ) // proved
                continue;
            assert( Vec_IntEntry(vClass, k) == iFin );
            if ( Vec_IntSize(vPat) == 0 )
            {
                Vec_Int_t * vNewClass = Vec_WecPushLevel( vRes );
                Vec_IntPushTwo( vNewClass, iFin, Index );  // index and first entry
                vClass = Vec_WecEntry( vRes, i );
                Vec_IntDrop( vClass, k+1 );
                Vec_IntDrop( vClass, k );
            }
            else // resimulate and refine
                Abc_NtkFinSimulateOne( pNtk, vTypes, vCos, vCis, vNodes, vMap2, vPat, vSims, nWords, vPairs, vRes, i, k/2 );
            Vec_IntFree( vPat );
            // make sure refinement happened (k'th entry is now absent or different)
            vClass = Vec_WecEntry( vRes, i );
            assert( Vec_IntSize(vClass) <= k || Vec_IntEntry(vClass, k) != iFin );
            k -= 2;
            //Vec_WecPrint( vRes, 0 );
        }
    }
    // unprepare
    Abc_NtkFinLocalSetdown( vPairs, vList, vMap2 );
    // reload proved equivs into the final array
    Vec_WecForEachLevel( vRes, vArray, i )
    {
        assert( Vec_IntSize(vArray) % 2 == 0 );
        if ( Vec_IntSize(vArray) <= 2 )
            continue;
        vClass = Vec_WecPushLevel( vResult );
        Vec_IntForEachEntryDouble( vArray, iFin, Index, k )
            Vec_IntPush( vClass, iFin );
    }
    Vec_WecFree( vRes );
    Vec_WrdFree( vSims );
    Vec_IntFree( vLits );
    return nCalls;
}